

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_types.cpp
# Opt level: O1

shared_ptr<duckdb::ExtraTypeInfo,_true> __thiscall
duckdb::AnyTypeInfo::Deserialize(AnyTypeInfo *this,Deserializer *deserializer)

{
  uint uVar1;
  int iVar2;
  AnyTypeInfo *pAVar3;
  undefined4 extraout_var;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<duckdb::ExtraTypeInfo,_true> sVar5;
  shared_ptr<duckdb::AnyTypeInfo,_true> result;
  shared_ptr<duckdb::AnyTypeInfo,_true> local_38;
  idx_t iVar4;
  
  pAVar3 = (AnyTypeInfo *)operator_new(0x58);
  AnyTypeInfo(pAVar3);
  local_38.internal.super___shared_ptr<duckdb::AnyTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       pAVar3;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<duckdb::AnyTypeInfo*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_38.internal.super___shared_ptr<duckdb::AnyTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,pAVar3);
  pAVar3 = shared_ptr<duckdb::AnyTypeInfo,_true>::operator->(&local_38);
  Deserializer::ReadProperty<duckdb::LogicalType>
            (deserializer,200,"target_type",&pAVar3->target_type);
  pAVar3 = shared_ptr<duckdb::AnyTypeInfo,_true>::operator->(&local_38);
  uVar1 = (*deserializer->_vptr_Deserializer[4])(deserializer,0xc9,"cast_score");
  if ((char)uVar1 == '\0') {
    iVar4 = 0;
  }
  else {
    iVar2 = (*deserializer->_vptr_Deserializer[0x15])(deserializer);
    iVar4 = CONCAT44(extraout_var,iVar2);
  }
  pAVar3->cast_score = iVar4;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar1 & 0xff));
  *(undefined8 *)&(this->super_ExtraTypeInfo).type = 0;
  (this->super_ExtraTypeInfo)._vptr_ExtraTypeInfo =
       (_func_int **)
       local_38.internal.super___shared_ptr<duckdb::AnyTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_ExtraTypeInfo).type =
       local_38.internal.super___shared_ptr<duckdb::AnyTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  sVar5.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar5.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ExtraTypeInfo;
  return (shared_ptr<duckdb::ExtraTypeInfo,_true>)
         sVar5.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<ExtraTypeInfo> AnyTypeInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::shared_ptr<AnyTypeInfo>(new AnyTypeInfo());
	deserializer.ReadProperty<LogicalType>(200, "target_type", result->target_type);
	deserializer.ReadPropertyWithDefault<idx_t>(201, "cast_score", result->cast_score);
	return std::move(result);
}